

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexst.cpp
# Opt level: O0

void __thiscall icu_63::RegexStaticSets::~RegexStaticSets(RegexStaticSets *this)

{
  UnicodeSet *this_00;
  void *in_RSI;
  UnicodeSet *local_30;
  int local_14;
  int32_t i;
  RegexStaticSets *this_local;
  
  for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
    this_00 = this->fPropSets[local_14];
    if (this_00 != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(this_00);
      UMemory::operator_delete((UMemory *)this_00,in_RSI);
    }
    this->fPropSets[local_14] = (UnicodeSet *)0x0;
  }
  this->fRuleDigitsAlias = (UnicodeSet *)0x0;
  utext_close_63(this->fEmptyText);
  UnicodeSet::~UnicodeSet(&this->fUnescapeCharSet);
  local_30 = &this->fUnescapeCharSet;
  do {
    local_30 = local_30 + -1;
    UnicodeSet::~UnicodeSet(local_30);
  } while (local_30 != (UnicodeSet *)&this->field_0x208);
  return;
}

Assistant:

RegexStaticSets::~RegexStaticSets() {
    int32_t i;

    for (i=0; i<URX_LAST_SET; i++) {
        delete fPropSets[i];
        fPropSets[i] = NULL;
    }
    fRuleDigitsAlias = NULL;
    
    utext_close(fEmptyText);
}